

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

void btFactorLDLT(btScalar *A,btScalar *d,int n,int nskip1)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ulong uVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  btScalar *pbVar11;
  long lVar12;
  int iVar13;
  btScalar *pbVar14;
  btScalar *pbVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  btScalar *pbVar19;
  long lVar20;
  long lVar21;
  float *pfVar22;
  int iVar23;
  uint uVar24;
  btScalar *pbVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  float *pfVar31;
  uint uVar32;
  long lVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  int local_d0;
  btScalar *local_b0;
  btScalar *local_a8;
  long local_88;
  long local_80;
  long local_78;
  
  if (0 < n) {
    if (n == 1) {
      fVar34 = 0.0;
      uVar16 = 0;
      pfVar31 = A;
    }
    else {
      lVar27 = (long)nskip1;
      lVar29 = (long)(nskip1 + 1);
      lVar1 = lVar27 * 8;
      pbVar14 = A + lVar27;
      pbVar15 = A + lVar29;
      pbVar19 = A + (nskip1 + 2);
      local_a8 = A + (nskip1 + 3);
      local_b0 = A + (nskip1 + 4);
      pbVar25 = A + (nskip1 + 5);
      local_d0 = 6;
      local_78 = 0;
      uVar16 = 0;
      pbVar11 = A;
      uVar24 = 8;
      local_88 = lVar29 * 4;
      local_80 = lVar27 * 4;
      do {
        uVar32 = uVar24;
        uVar7 = uVar16;
        pfVar31 = A + uVar7 * lVar27;
        if (uVar7 == 0) {
          fVar34 = 0.0;
          fVar38 = 0.0;
          fVar39 = 0.0;
        }
        else {
          iVar13 = 2;
          lVar10 = 0;
          uVar16 = 0;
          lVar17 = lVar27 * 4;
          lVar20 = lVar29 * 4;
          do {
            if (uVar16 == 0) {
              lVar30 = 0;
              fVar34 = 0.0;
              fVar38 = 0.0;
              fVar39 = 0.0;
              fVar40 = 0.0;
              pfVar9 = pfVar31;
            }
            else {
              fVar34 = 0.0;
              fVar38 = 0.0;
              fVar39 = 0.0;
              fVar40 = 0.0;
              lVar8 = local_78;
              lVar12 = local_80;
              lVar21 = local_88;
              lVar28 = lVar20;
              lVar30 = lVar10;
              lVar33 = lVar17;
              iVar23 = iVar13;
              do {
                fVar2 = *(float *)((long)A + lVar8 + 4);
                fVar48 = *(float *)((long)A + lVar30 + 4);
                fVar34 = fVar2 * fVar48 +
                         *(float *)((long)A + lVar8) * *(float *)((long)A + lVar30) + fVar34;
                fVar38 = *(float *)((long)A + lVar21) * fVar48 +
                         *(float *)((long)A + lVar12) * *(float *)((long)A + lVar30) + fVar38;
                fVar39 = *(float *)((long)A + lVar28) * fVar2 +
                         *(float *)((long)A + lVar33) * *(float *)((long)A + lVar8) + fVar39;
                fVar40 = *(float *)((long)A + lVar28) * *(float *)((long)A + lVar21) +
                         *(float *)((long)A + lVar33) * *(float *)((long)A + lVar12) + fVar40;
                iVar23 = iVar23 + -2;
                lVar30 = lVar30 + 8;
                lVar28 = lVar28 + 8;
                lVar33 = lVar33 + 8;
                lVar8 = lVar8 + 8;
                lVar21 = lVar21 + 8;
                lVar12 = lVar12 + 8;
              } while (3 < iVar23);
              pfVar9 = (float *)(lVar8 + (long)A);
            }
            fVar2 = *pfVar9;
            *pfVar9 = fVar2 - fVar34;
            fVar48 = pfVar9[lVar27];
            pfVar9[lVar27] = fVar48 - fVar38;
            fVar55 = *(float *)((long)A + lVar27 * 4 + lVar30);
            pfVar9[1] = (pfVar9[1] - fVar39) - (fVar2 - fVar34) * fVar55;
            pfVar9[lVar29] = (pfVar9[lVar29] - fVar40) - (fVar48 - fVar38) * fVar55;
            uVar16 = uVar16 + 2;
            iVar13 = iVar13 + 2;
            lVar10 = lVar10 + lVar1;
            lVar20 = lVar20 + lVar1;
            lVar17 = lVar17 + lVar1;
          } while (uVar16 < uVar7);
          fVar34 = 0.0;
          fVar38 = 0.0;
          fVar39 = 0.0;
          if (uVar7 < 6) {
            iVar13 = (int)uVar7;
            pfVar9 = d;
          }
          else {
            lVar17 = 0;
            iVar23 = local_d0;
            do {
              iVar13 = iVar23;
              fVar40 = *(float *)((long)pbVar11 + lVar17);
              fVar2 = *(float *)((long)pbVar14 + lVar17);
              fVar42 = *(float *)((long)d + lVar17) * fVar40;
              fVar49 = *(float *)((long)d + lVar17) * fVar2;
              *(float *)((long)pbVar11 + lVar17) = fVar42;
              *(float *)((long)pbVar14 + lVar17) = fVar49;
              fVar48 = *(float *)((long)pbVar11 + lVar17 + 4);
              fVar55 = *(float *)((long)pbVar15 + lVar17);
              fVar50 = *(float *)((long)d + lVar17 + 4);
              fVar43 = fVar50 * fVar48;
              fVar50 = fVar50 * fVar55;
              *(float *)((long)pbVar11 + lVar17 + 4) = fVar43;
              *(float *)((long)pbVar15 + lVar17) = fVar50;
              fVar35 = *(float *)((long)pbVar11 + lVar17 + 8);
              fVar36 = *(float *)((long)pbVar19 + lVar17);
              fVar51 = *(float *)((long)d + lVar17 + 8);
              fVar44 = fVar51 * fVar35;
              fVar51 = fVar51 * fVar36;
              *(float *)((long)pbVar11 + lVar17 + 8) = fVar44;
              *(float *)((long)pbVar19 + lVar17) = fVar51;
              fVar37 = *(float *)((long)pbVar11 + lVar17 + 0xc);
              fVar41 = *(float *)((long)local_a8 + lVar17);
              fVar52 = *(float *)((long)d + lVar17 + 0xc);
              fVar45 = fVar52 * fVar37;
              fVar52 = fVar52 * fVar41;
              *(float *)((long)pbVar11 + lVar17 + 0xc) = fVar45;
              *(float *)((long)local_a8 + lVar17) = fVar52;
              fVar3 = *(float *)((long)pbVar11 + lVar17 + 0x10);
              fVar4 = *(float *)((long)local_b0 + lVar17);
              fVar53 = *(float *)((long)d + lVar17 + 0x10);
              fVar46 = fVar53 * fVar3;
              fVar53 = fVar53 * fVar4;
              *(float *)((long)pbVar11 + lVar17 + 0x10) = fVar46;
              *(float *)((long)local_b0 + lVar17) = fVar53;
              fVar5 = *(float *)((long)pbVar11 + lVar17 + 0x14);
              fVar6 = *(float *)((long)pbVar25 + lVar17);
              fVar54 = *(float *)((long)d + lVar17 + 0x14);
              fVar47 = fVar54 * fVar5;
              fVar54 = fVar54 * fVar6;
              *(float *)((long)pbVar11 + lVar17 + 0x14) = fVar47;
              *(float *)((long)pbVar25 + lVar17) = fVar54;
              fVar39 = fVar5 * fVar47 +
                       fVar3 * fVar46 +
                       fVar37 * fVar45 +
                       fVar35 * fVar44 + fVar48 * fVar43 + fVar40 * fVar42 + fVar39;
              fVar34 = fVar6 * fVar47 +
                       fVar4 * fVar46 +
                       fVar41 * fVar45 + fVar36 * fVar44 + fVar55 * fVar43 + fVar2 * fVar42 + fVar34
              ;
              fVar38 = fVar6 * fVar54 +
                       fVar4 * fVar53 +
                       fVar41 * fVar52 + fVar36 * fVar51 + fVar55 * fVar50 + fVar2 * fVar49 + fVar38
              ;
              lVar17 = lVar17 + 0x18;
              iVar23 = iVar13 + -6;
            } while (0xb < iVar23);
            pfVar31 = (float *)(lVar17 + (long)pbVar11);
            iVar13 = iVar13 + -0xc;
            pfVar9 = (float *)((long)d + lVar17);
          }
          if (0 < iVar13) {
            uVar24 = iVar13 + 1;
            do {
              fVar40 = *pfVar31;
              fVar2 = pfVar31[lVar27];
              fVar48 = *pfVar9 * fVar40;
              fVar55 = *pfVar9 * fVar2;
              *pfVar31 = fVar48;
              pfVar31[lVar27] = fVar55;
              fVar39 = fVar39 + fVar40 * fVar48;
              fVar34 = fVar34 + fVar2 * fVar48;
              fVar38 = fVar38 + fVar2 * fVar55;
              pfVar31 = pfVar31 + 1;
              pfVar9 = pfVar9 + 1;
              uVar24 = uVar24 - 1;
            } while (1 < uVar24);
          }
        }
        fVar40 = pfVar31[lVar27];
        fVar2 = pfVar31[lVar29];
        fVar39 = 1.0 / (*pfVar31 - fVar39);
        d[uVar7] = fVar39;
        fVar39 = fVar39 * (fVar40 - fVar34);
        d[uVar7 + 1] = 1.0 / ((fVar2 - fVar38) - ((fVar40 - fVar34) * fVar39 + 0.0));
        pfVar31[lVar27] = fVar39;
        uVar16 = uVar7 + 2;
        local_78 = local_78 + lVar1;
        local_88 = local_88 + lVar1;
        local_80 = local_80 + lVar1;
        pbVar14 = pbVar14 + lVar27 * 2;
        pbVar15 = pbVar15 + lVar27 * 2;
        pbVar19 = pbVar19 + lVar27 * 2;
        local_a8 = local_a8 + lVar27 * 2;
        local_b0 = local_b0 + lVar27 * 2;
        pbVar25 = pbVar25 + lVar27 * 2;
        pbVar11 = pbVar11 + lVar27 * 2;
        local_d0 = local_d0 + 2;
        uVar24 = uVar32 + 2;
      } while (uVar16 <= n - 2);
      iVar13 = (int)uVar16;
      if (n - iVar13 != 1) {
        return;
      }
      pfVar31 = A + nskip1 * iVar13;
      iVar23 = 2;
      uVar26 = 0;
      do {
        pfVar9 = A + uVar26 * lVar27;
        fVar34 = 0.0;
        fVar38 = 0.0;
        pfVar22 = pfVar31;
        iVar18 = iVar23;
        if (uVar26 != 0) {
          do {
            fVar34 = pfVar9[1] * pfVar22[1] + *pfVar9 * *pfVar22 + fVar34;
            fVar38 = pfVar9[lVar29] * pfVar22[1] + pfVar9[lVar27] * *pfVar22 + fVar38;
            pfVar9 = pfVar9 + 2;
            pfVar22 = pfVar22 + 2;
            iVar18 = iVar18 + -2;
          } while (3 < iVar18);
        }
        fVar39 = *pfVar22;
        *pfVar22 = fVar39 - fVar34;
        pfVar22[1] = (pfVar22[1] - fVar38) - (fVar39 - fVar34) * pfVar9[lVar27];
        uVar26 = uVar26 + 2;
        iVar23 = iVar23 + 2;
      } while (uVar26 < (uVar16 & 0xffffffff));
      fVar34 = 0.0;
      pfVar9 = d;
      if (3 < uVar7) {
        do {
          uVar24 = uVar32;
          fVar38 = *pfVar31;
          fVar39 = pfVar31[1];
          fVar41 = *pfVar9 * fVar38;
          *pfVar31 = fVar41;
          fVar50 = pfVar9[1] * fVar39;
          pfVar31[1] = fVar50;
          fVar40 = pfVar31[2];
          fVar51 = pfVar9[2] * fVar40;
          pfVar31[2] = fVar51;
          fVar2 = pfVar31[3];
          fVar36 = pfVar9[3] * fVar2;
          pfVar31[3] = fVar36;
          fVar48 = pfVar31[4];
          fVar37 = pfVar9[4] * fVar48;
          pfVar31[4] = fVar37;
          fVar55 = pfVar31[5];
          fVar35 = pfVar9[5] * fVar55;
          pfVar31[5] = fVar35;
          fVar34 = fVar35 * fVar55 +
                   fVar37 * fVar48 +
                   fVar36 * fVar2 + fVar51 * fVar40 + fVar50 * fVar39 + fVar41 * fVar38 + fVar34;
          pfVar31 = pfVar31 + 6;
          pfVar9 = pfVar9 + 6;
          uVar32 = uVar24 - 6;
        } while (0xb < uVar32);
        iVar13 = uVar24 - 0xc;
      }
      if (0 < iVar13) {
        uVar24 = iVar13 + 1;
        do {
          fVar38 = *pfVar31;
          fVar39 = *pfVar9 * fVar38;
          *pfVar31 = fVar39;
          fVar34 = fVar34 + fVar39 * fVar38;
          pfVar31 = pfVar31 + 1;
          pfVar9 = pfVar9 + 1;
          uVar24 = uVar24 - 1;
        } while (1 < uVar24);
      }
    }
    d[uVar16 & 0xffffffff] = 1.0 / (*pfVar31 - fVar34);
  }
  return;
}

Assistant:

void btFactorLDLT (btScalar *A, btScalar *d, int n, int nskip1)
{  
  int i,j;
  btScalar sum,*ell,*dee,dd,p1,p2,q1,q2,Z11,m11,Z21,m21,Z22,m22;
  if (n < 1) return;
  
  for (i=0; i<=n-2; i += 2) {
    /* solve L*(D*l)=a, l is scaled elements in 2 x i block at A(i,0) */
    btSolveL1_2 (A,A+i*nskip1,i,nskip1);
    /* scale the elements in a 2 x i block at A(i,0), and also */
    /* compute Z = the outer product matrix that we'll need. */
    Z11 = 0;
    Z21 = 0;
    Z22 = 0;
    ell = A+i*nskip1;
    dee = d;
    for (j=i-6; j >= 0; j -= 6) {
      p1 = ell[0];
      p2 = ell[nskip1];
      dd = dee[0];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[0] = q1;
      ell[nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[1];
      p2 = ell[1+nskip1];
      dd = dee[1];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[1] = q1;
      ell[1+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[2];
      p2 = ell[2+nskip1];
      dd = dee[2];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[2] = q1;
      ell[2+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[3];
      p2 = ell[3+nskip1];
      dd = dee[3];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[3] = q1;
      ell[3+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[4];
      p2 = ell[4+nskip1];
      dd = dee[4];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[4] = q1;
      ell[4+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[5];
      p2 = ell[5+nskip1];
      dd = dee[5];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[5] = q1;
      ell[5+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      ell += 6;
      dee += 6;
    }
    /* compute left-over iterations */
    j += 6;
    for (; j > 0; j--) {
      p1 = ell[0];
      p2 = ell[nskip1];
      dd = dee[0];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[0] = q1;
      ell[nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      ell++;
      dee++;
    }
    /* solve for diagonal 2 x 2 block at A(i,i) */
    Z11 = ell[0] - Z11;
    Z21 = ell[nskip1] - Z21;
    Z22 = ell[1+nskip1] - Z22;
    dee = d + i;
    /* factorize 2 x 2 block Z,dee */
    /* factorize row 1 */
    dee[0] = btRecip(Z11);
    /* factorize row 2 */
    sum = 0;
    q1 = Z21;
    q2 = q1 * dee[0];
    Z21 = q2;
    sum += q1*q2;
    dee[1] = btRecip(Z22 - sum);
    /* done factorizing 2 x 2 block */
    ell[nskip1] = Z21;
  }
  /* compute the (less than 2) rows at the bottom */
  switch (n-i) {
    case 0:
    break;
    
    case 1:
    btSolveL1_1 (A,A+i*nskip1,i,nskip1);
    /* scale the elements in a 1 x i block at A(i,0), and also */
    /* compute Z = the outer product matrix that we'll need. */
    Z11 = 0;
    ell = A+i*nskip1;
    dee = d;
    for (j=i-6; j >= 0; j -= 6) {
      p1 = ell[0];
      dd = dee[0];
      q1 = p1*dd;
      ell[0] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[1];
      dd = dee[1];
      q1 = p1*dd;
      ell[1] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[2];
      dd = dee[2];
      q1 = p1*dd;
      ell[2] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[3];
      dd = dee[3];
      q1 = p1*dd;
      ell[3] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[4];
      dd = dee[4];
      q1 = p1*dd;
      ell[4] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[5];
      dd = dee[5];
      q1 = p1*dd;
      ell[5] = q1;
      m11 = p1*q1;
      Z11 += m11;
      ell += 6;
      dee += 6;
    }
    /* compute left-over iterations */
    j += 6;
    for (; j > 0; j--) {
      p1 = ell[0];
      dd = dee[0];
      q1 = p1*dd;
      ell[0] = q1;
      m11 = p1*q1;
      Z11 += m11;
      ell++;
      dee++;
    }
    /* solve for diagonal 1 x 1 block at A(i,i) */
    Z11 = ell[0] - Z11;
    dee = d + i;
    /* factorize 1 x 1 block Z,dee */
    /* factorize row 1 */
    dee[0] = btRecip(Z11);
    /* done factorizing 1 x 1 block */
    break;
    
    //default: *((char*)0)=0;  /* this should never happen! */
  }
}